

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsTypes.cpp
# Opt level: O2

SmallBuffer * helics::typeConvert(SmallBuffer *__return_storage_ptr__,DataType type,Time val)

{
  value_t vVar1;
  json_value jVar2;
  undefined1 auVar3 [16];
  double valval;
  char *pcVar4;
  undefined8 uVar5;
  string *val_00;
  reference pvVar6;
  string *this;
  string_view valname;
  initializer_list<double> __l;
  string_view valname_00;
  vector<double,_std::allocator<double>_> vec;
  json json;
  double local_40;
  data local_38;
  data local_28;
  
  this = (string *)&vec;
  switch(type) {
  case HELICS_STRING:
  case HELICS_CHAR:
    helicsIntString_abi_cxx11_((string *)&vec,(helics *)val.internalTimeCode,val.internalTimeCode);
    json.m_data._0_8_ =
         vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_finish;
    json.m_data.m_value.object =
         (object_t *)
         vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_start;
    ValueConverter<std::basic_string_view<char,_std::char_traits<char>_>_>::convert
              (__return_storage_ptr__,(basic_string_view<char,_std::char_traits<char>_> *)&json);
    this = (string *)&vec;
    goto LAB_001e9482;
  case HELICS_DOUBLE:
    vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)((double)(val.internalTimeCode % 1000000000) * 1e-09 +
                    (double)(val.internalTimeCode / 1000000000));
    ValueConverter<double>::convert(__return_storage_ptr__,(double *)&vec);
    break;
  case HELICS_INT:
  case HELICS_TIME:
    vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)val.internalTimeCode;
    ValueConverter<long>::convert(__return_storage_ptr__,(long *)&vec);
    break;
  case HELICS_VECTOR:
    json.m_data._0_8_ =
         (double)(val.internalTimeCode % 1000000000) * 1e-09 +
         (double)(val.internalTimeCode / 1000000000);
    __l._M_len = 1;
    __l._M_array = (iterator)&json;
    std::vector<double,_std::allocator<double>_>::vector(&vec,__l,(allocator_type *)&local_40);
    ValueConverter<std::vector<double,_std::allocator<double>_>_>::convert
              (__return_storage_ptr__,&vec);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&vec.super__Vector_base<double,_std::allocator<double>_>);
    break;
  case HELICS_COMPLEX_VECTOR:
    vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    json.m_data._0_8_ =
         (double)(val.internalTimeCode % 1000000000) * 1e-09 +
         (double)(val.internalTimeCode / 1000000000);
    local_40 = 0.0;
    std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
    emplace_back<double,double>
              ((vector<std::complex<double>,std::allocator<std::complex<double>>> *)&vec,
               (double *)&json,&local_40);
    ValueConverter<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>::
    convert(__return_storage_ptr__,
            (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&vec);
    std::_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>::~_Vector_base
              ((_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&vec);
    break;
  case HELICS_NAMED_POINT:
    if ((ulong)val.internalTimeCode < 0x10000000000001) {
      auVar3._8_8_ = 0;
      auVar3._0_8_ = val.internalTimeCode;
      valname_00._M_str = "value";
      valname_00._M_len = 5;
      NamedPoint::NamedPoint
                ((NamedPoint *)&vec,valname_00,
                 (double)SUB164(auVar3 % ZEXT816(1000000000),0) * 1e-09 +
                 (double)((ulong)val.internalTimeCode / 1000000000));
      ValueConverter<helics::NamedPoint>::convert(__return_storage_ptr__,(NamedPoint *)&vec);
    }
    else {
      helicsIntString_abi_cxx11_
                ((string *)&json,(helics *)val.internalTimeCode,val.internalTimeCode);
      jVar2 = json.m_data.m_value;
      uVar5 = json.m_data._0_8_;
      valval = nan("0");
      valname._M_str = (char *)uVar5;
      valname._M_len = (size_t)jVar2.object;
      NamedPoint::NamedPoint((NamedPoint *)&vec,valname,valval);
      ValueConverter<helics::NamedPoint>::convert(__return_storage_ptr__,(NamedPoint *)&vec);
      std::__cxx11::string::~string((string *)&vec);
      this = (string *)&json;
    }
LAB_001e9482:
    std::__cxx11::string::~string(this);
    break;
  case HELICS_BOOL:
    pcVar4 = "*1";
    if (val.internalTimeCode == 0) {
      pcVar4 = "+0";
    }
    vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)(pcVar4 + 1);
    vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x1;
    ValueConverter<std::basic_string_view<char,_std::char_traits<char>_>_>::convert
              (__return_storage_ptr__,(basic_string_view<char,_std::char_traits<char>_> *)&vec);
    break;
  default:
    if (type == HELICS_JSON) {
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json(&json,(nullptr_t)0x0);
      val_00 = typeNameStringRef_abi_cxx11_(HELICS_TIME);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::
      basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_28,val_00);
      pvVar6 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           *)&json,"type");
      vVar1 = (pvVar6->m_data).m_type;
      (pvVar6->m_data).m_type = local_28.m_type;
      jVar2 = (pvVar6->m_data).m_value;
      (pvVar6->m_data).m_value = local_28.m_value;
      local_28.m_type = vVar1;
      local_28.m_value = jVar2;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_28);
      vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)val.internalTimeCode;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json<long,_long,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_38,(long *)&vec);
      pvVar6 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           *)&json,"value");
      vVar1 = (pvVar6->m_data).m_type;
      (pvVar6->m_data).m_type = local_38.m_type;
      jVar2 = (pvVar6->m_data).m_value;
      (pvVar6->m_data).m_value = local_38.m_value;
      local_38.m_type = vVar1;
      local_38.m_value = jVar2;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_38);
      fileops::generateJsonString((string *)&vec,&json,true);
      SmallBuffer::SmallBuffer<std::__cxx11::string,void>
                (__return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vec);
      std::__cxx11::string::~string((string *)&vec);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&json.m_data);
      return __return_storage_ptr__;
    }
  case HELICS_COMPLEX:
    vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)((double)(val.internalTimeCode % 1000000000) * 1e-09 +
                    (double)(val.internalTimeCode / 1000000000));
    vec.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    ValueConverter<std::complex<double>_>::convert(__return_storage_ptr__,(complex<double> *)&vec);
    return __return_storage_ptr__;
  }
  return __return_storage_ptr__;
}

Assistant:

SmallBuffer typeConvert(DataType type, Time val)
{
    switch (type) {
        case DataType::HELICS_DOUBLE:
            return ValueConverter<double>::convert(static_cast<double>(val));
        case DataType::HELICS_INT:
        case DataType::HELICS_TIME:
            return ValueConverter<int64_t>::convert(val.getBaseTimeCode());
        case DataType::HELICS_COMPLEX:
        default:
            return ValueConverter<std::complex<double>>::convert(
                std::complex<double>(static_cast<double>(val), 0.0));
        case DataType::HELICS_BOOL:
            return ValueConverter<std::string_view>::convert((val != timeZero) ? "1" : "0");
        case DataType::HELICS_STRING:
        case DataType::HELICS_CHAR:
            return ValueConverter<std::string_view>::convert(
                helicsIntString(val.getBaseTimeCode()));
        case DataType::HELICS_NAMED_POINT:
            if (static_cast<uint64_t>(val.getBaseTimeCode()) >
                (2ULL << 51U))  // this checks whether the actual value will fit in a double
            {
                return ValueConverter<NamedPoint>::convert(
                    NamedPoint{helicsIntString(val.getBaseTimeCode()), std::nan("0")});
            } else {
                return ValueConverter<NamedPoint>::convert(
                    NamedPoint{"value", static_cast<double>(val)});
            }
        case DataType::HELICS_COMPLEX_VECTOR: {
            std::vector<std::complex<double>> cval;
            cval.emplace_back(static_cast<double>(val), 0.0);
            return ValueConverter<std::vector<std::complex<double>>>::convert(cval);
        }
        case DataType::HELICS_VECTOR: {
            const std::vector<double> vec{static_cast<double>(val)};
            return ValueConverter<std::vector<double>>::convert(vec);
        }
        case DataType::HELICS_JSON: {
            nlohmann::json json;
            json["type"] = typeNameStringRef(DataType::HELICS_TIME);
            json["value"] = val.getBaseTimeCode();
            return fileops::generateJsonString(json);
        }
    }
}